

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.h
# Opt level: O0

bool __thiscall MeCab::Dictionary::isCompatible(Dictionary *this,Dictionary *d)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  char *in_stack_00000038;
  undefined1 local_11;
  
  local_11 = false;
  if (((*(int *)(in_RDI + 0x30) == *(int *)(in_RSI + 0x30)) &&
      (local_11 = false, *(int *)(in_RDI + 0x3c) == *(int *)(in_RSI + 0x3c))) &&
     (local_11 = false, *(int *)(in_RDI + 0x40) == *(int *)(in_RSI + 0x40))) {
    iVar1 = decode_charset(in_stack_00000038);
    iVar2 = decode_charset(in_stack_00000038);
    local_11 = iVar1 == iVar2;
  }
  return local_11;
}

Assistant:

bool isCompatible(const Dictionary &d) const {
    return(version_ == d.version_ &&
           lsize_  == d.lsize_   &&
           rsize_  == d.rsize_   &&
           decode_charset(charset_) ==
           decode_charset(d.charset_));
  }